

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O0

void __thiscall Markov::Connection::TrainPart(Connection *this,string_view src,TrainData *td)

{
  char **ppcVar1;
  csub_match m;
  bool bVar2;
  const_iterator __a;
  const_iterator __b;
  value_type *pvVar3;
  string_view src_00;
  undefined8 in_stack_fffffffffffffdf0;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)> *this_00;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  Connection *local_1b0;
  char *local_1a8;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  char *local_108;
  char *pcStack_100;
  undefined8 local_f8;
  string_view local_f0;
  undefined1 local_d0 [8];
  sviterator iter;
  regex_type nline;
  TrainData *td_local;
  Connection *this_local;
  string_view src_local;
  
  src_local._M_len = (size_t)src._M_str;
  this_local = (Connection *)src._M_len;
  if (((td->conf).splitstr & 1U) == 0) {
    local_1b0 = this_local;
    local_1a8 = (char *)src_local._M_len;
    TrainFinal(this,src,td);
  }
  else {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&iter._M_has_m1,"\\n+",0x10);
    __a = std::basic_string_view<char,_std::char_traits<char>_>::begin
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    __b = std::basic_string_view<char,_std::char_traits<char>_>::end
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    regex_token_iterator
              ((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
               local_d0,__a,__b,(regex_type *)&iter._M_has_m1,-1,0);
    while( true ) {
      bVar2 = std::__cxx11::
              regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
              operator!=((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                          *)local_d0,&td->badIter);
      if (!bVar2) break;
      pvVar3 = std::__cxx11::
               regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
               operator*((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                          *)local_d0);
      local_f8 = *(undefined8 *)&pvVar3->matched;
      local_108 = (pvVar3->super_pair<const_char_*,_const_char_*>).first;
      ppcVar1 = &(pvVar3->super_pair<const_char_*,_const_char_*>).second;
      pcStack_100 = *ppcVar1;
      m._16_8_ = in_stack_fffffffffffffdf0;
      m.super_pair<const_char_*,_const_char_*> = *(pair<const_char_*,_const_char_*> *)ppcVar1;
      src_00 = anon_unknown.dwarf_22748::matchToSv(m);
      local_f0 = src_00;
      TrainFinal(this,src_00,td);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"\n");
      std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>::operator()
                (&td->func,local_118,false);
      std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
      operator++(&local_1a0,
                 (regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                 local_d0,0);
      std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
      ~regex_token_iterator(&local_1a0);
    }
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    ~regex_token_iterator
              ((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
               local_d0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&iter._M_has_m1);
  }
  this_00 = &td->func;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0,"");
  std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>::operator()
            (this_00,local_1c0,true);
  return;
}

Assistant:

void Connection::TrainPart(std::string_view src, const TrainData& td) {
		if (td.conf.splitstr) {
				regex_type nline("\\n+");

				for (auto iter = sviterator(src.begin(), src.end(), nline, -1); iter != td.badIter; iter++) {
						TrainFinal(matchToSv(*iter), td);
						td.func("\n", false);
						}
				}
		else {
				TrainFinal(src, td);
				}

		td.func("", true);
		}